

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver3L1Q<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SrcEvaluatorType srcEvaluator_1;
  CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_> *pCVar7;
  MatrixVType *this;
  Scalar *pSVar8;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *pCVar9;
  ostream *poVar10;
  long index;
  Scalar SVar11;
  float a;
  float local_958;
  float local_954;
  float local_950;
  float local_94c;
  float local_948;
  float local_944;
  float local_940;
  float local_93c;
  float local_938;
  float local_934;
  float local_930;
  float local_92c;
  float local_928;
  float local_924;
  float local_920;
  float local_91c;
  float local_918;
  float local_914;
  float local_910;
  float local_90c;
  float local_908;
  float local_904;
  float local_900;
  float local_8fc;
  float local_8f8;
  float local_8f4;
  float local_8f0;
  float local_8ec;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  b;
  Matrix<float,_6,_1,_0,_6,_1> L3_1;
  Matrix<float,__1,_1,_0,__1,_1> b1;
  Matrix<float,__1,_1,_0,__1,_1> b4;
  Matrix<float,__1,_1,_0,__1,_1> b3;
  Matrix<float,__1,_1,_0,__1,_1> b2;
  Matrix<float,_1,_1,0,_1,_1> *local_830;
  DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_> *local_828;
  Matrix<float,_4,_4,_0,_4,_4> *local_820;
  BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> svd;
  Matrix<float,_6,_1,_0,_6,_1> L2_1;
  Matrix<float,_3,_1,_0,_3,_1> D3;
  Matrix<float,_3,_1,_0,_3,_1> D2;
  Matrix<float,_3,_1,_0,_3,_1> D1;
  Matrix<float,_3,_1,_0,_3,_1> tQ32;
  Matrix<float,_3,_1,_0,_3,_1> tQ31;
  Matrix<float,_3,_1,_0,_3,_1> tQ22;
  Matrix<float,_3,_1,_0,_3,_1> tQ21;
  Matrix<float,_3,_1,_0,_3,_1> tQ12;
  Matrix<float,_3,_1,_0,_3,_1> tQ11;
  Matrix<float,_9,_6,_0,_9,_6> B;
  Matrix<float,__1,_1,_0,__1,_1> b5;
  Matrix<float,_6,_1,_0,_6,_1> L1_1;
  Matrix<float,_6,_1,_0,_6,_1> M3_1;
  Matrix<float,_6,_1,_0,_6,_1> M2_1;
  Matrix<float,_6,_1,_0,_6,_1> M1_1;
  float local_534;
  float local_530;
  float local_52c;
  float local_528;
  float local_524;
  float local_520;
  float local_51c;
  float local_518;
  float local_514;
  float local_510;
  float local_50c;
  float local_508;
  float local_504;
  Matrix<float,_3,_1,_0,_3,_1> tP32;
  Matrix<float,_3,_1,_0,_3,_1> tP31;
  Matrix<float,_3,_1,_0,_3,_1> tP22;
  Matrix<float,_3,_1,_0,_3,_1> tP21;
  Matrix<float,_3,_1,_0,_3,_1> tP12;
  Matrix<float,_3,_1,_0,_3,_1> tP11;
  undefined1 local_4b8 [8];
  variable_if_dynamic<long,__1> local_4b0;
  variable_if_dynamic<long,__1> local_4a8;
  variable_if_dynamic<long,__1> local_4a0;
  _Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_478;
  Matrix<float,_6,_1,_0,_6,_1> L3;
  Matrix<float,_6,_1,_0,_6,_1> L2;
  Matrix<float,_6,_1,_0,_6,_1> L1;
  Matrix<float,_4,_1,_0,_4,_1> R32_B;
  Matrix<float,_4,_1,_0,_4,_1> R31_B;
  Matrix<float,_4,_1,_0,_4,_1> Q32;
  Matrix<float,_4,_1,_0,_4,_1> Q31;
  Matrix<float,_4,_1,_0,_4,_1> R22_B;
  Matrix<float,_4,_1,_0,_4,_1> R21_B;
  Matrix<float,_4,_1,_0,_4,_1> Q22;
  Matrix<float,_4,_1,_0,_4,_1> Q21;
  Matrix<float,_4,_1,_0,_4,_1> R12_B;
  Matrix<float,_4,_1,_0,_4,_1> R11_B;
  Matrix<float,_4,_1,_0,_4,_1> Q12;
  Matrix<float,__1,__1,_0,__1,__1> P;
  Matrix<float,__1,__1,_0,__1,__1> local_350;
  Matrix<float,_3,_1,_0,_3,_1> local_338;
  Matrix<float,_3,_1,_0,_3,_1> local_32c;
  Matrix<float,_6,_1,_0,_6,_1> M3;
  Matrix<float,_6,_1,_0,_6,_1> M2;
  Matrix<float,_6,_1,_0,_6,_1> M1;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Matrix<float,_4,_4,_0,_4,_4> TV;
  Matrix<float,_4,_1,_0,_4,_1> Q11;
  Matrix<float,_4,_4,_0,_4,_4> TP;
  Matrix<float,_6,_1,_0,_6,_1> b_sol;
  Matrix<float,_4,_1,_0,_4,_1> local_1e8;
  Matrix<float,_4,_1,_0,_4,_1> local_1d8;
  Matrix<float,_3,_9,_0,_3,_9> A;
  Matrix<float,_6,_6,_0,_6,_6> transLineV;
  Matrix<float,_6,_6,_0,_6,_6> transLineU;
  
  pfVar1 = *(float **)ptPair;
  if ((*(float **)(ptPair + 8) != pfVar1) &&
     (pfVar2 = *(float **)lPair, 0x80 < (ulong)(*(long *)(lPair + 8) - (long)pfVar2))) {
    uVar3 = *(undefined8 *)pfVar1;
    uVar4 = *(undefined8 *)(pfVar1 + 2);
    uVar5 = *(undefined8 *)(pfVar1 + 4);
    uVar6 = *(undefined8 *)(pfVar1 + 6);
    Q11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)pfVar2;
    Q11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 2);
    Q12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 4);
    Q12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 6);
    R11_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 8);
    R11_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 10);
    R12_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0xc);
    R12_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0xe);
    Q21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x10);
    Q21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x12);
    Q22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x14);
    Q22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x16);
    R21_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x18);
    R21_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x1a);
    R22_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x1c);
    R22_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x1e);
    Q31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x20);
    Q31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x22);
    Q32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x24);
    Q32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x26);
    R31_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x28);
    R31_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x2a);
    R32_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x2c);
    R32_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x2e);
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q11,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               Q11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP11,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q12,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               Q12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP12,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&R11_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               R11_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ11,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&R12_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               R12_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ12,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q21,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               Q21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP21,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q22,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               Q22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP22,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&R21_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               R21_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ21,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&R22_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               R22_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ22,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q31,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               Q31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP31,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q32,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               Q32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP32,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&R31_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               R31_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ31,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&R32_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&svd,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&B,
               R32_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ32,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&svd);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&tP12;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&tP11;
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&D1,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,&D1);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[1] =
         tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[2] =
         tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,
               (Matrix<float,_3,_1,_0,_3,_1> *)&B);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L1,3);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L1,(Scalar *)&B);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&tP22;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&tP21;
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&D2,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,&D2);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[1] =
         tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[2] =
         tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,
               (Matrix<float,_3,_1,_0,_3,_1> *)&B);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L2,3);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L2,(Scalar *)&B);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&tP32;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&tP31;
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&D3,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,&D3);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[1] =
         tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[2] =
         tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,
               (Matrix<float,_3,_1,_0,_3,_1> *)&B);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L3,3);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L3,(Scalar *)&B);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&tQ12;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&tQ11;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,&D1);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[1] =
         tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[2] =
         tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,
               (Matrix<float,_3,_1,_0,_3,_1> *)&B);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M1,3);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M1,(Scalar *)&B);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&tQ22;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&tQ21;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              (&D2,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,&D2);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[1] =
         tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[2] =
         tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,
               (Matrix<float,_3,_1,_0,_3,_1> *)&B);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M2,3);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M2,(Scalar *)&B);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&tQ32;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&tQ31;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              (&D3,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,&D3);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[1] =
         tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[2] =
         tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&svd,
               (Matrix<float,_3,_1,_0,_3,_1> *)&B);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&svd,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M3,3);
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &svd);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&M3,(Scalar *)&B);
    local_1e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
    _0_8_ = uVar5;
    local_1e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
    _8_8_ = uVar6;
    local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
    _0_8_ = uVar3;
    local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
    _8_8_ = uVar4;
    getPredefinedTransformations3L1Q<float>
              ((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)&local_478,&local_1d8,&local_1e8);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)
          local_478._M_impl.super__Vector_impl_data._M_finish[-1].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._16_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._24_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._32_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._40_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._48_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc)
    ;
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe)
    ;
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)
          local_478._M_impl.super__Vector_impl_data._M_finish[-2].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._16_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._24_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._32_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._40_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._48_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc)
    ;
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_ =
         *(undefined8 *)
          (local_478._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe)
    ;
    local_478._M_impl.super__Vector_impl_data._M_finish =
         local_478._M_impl.super__Vector_impl_data._M_finish + -2;
    Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&svd,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&B,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&B,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&svd,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)&B,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&B,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&svd);
    L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         -NAN;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)
                    local_4b8,&TU,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&svd,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
               local_4b8,3);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_32c,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&svd);
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)&L1_1,&local_32c);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                      *)&L2_1,(int *)&L3_1,(StorageBaseType *)&L1_1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&A,&TU,3,3);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&B,(Lhs *)&L2_1,(Rhs *)&A);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)&TP,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TP,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&B);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&svd,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&B,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&B,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&svd);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&svd,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)&B,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&B,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&svd);
    L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         -NAN;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)
                    local_4b8,&TV,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&svd,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
               local_4b8,3);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_338,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&svd);
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)&L1_1,&local_338);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                      *)&L2_1,(int *)&L3_1,(StorageBaseType *)&L1_1);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&A,&TV,3,3);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&B,(Lhs *)&L2_1,(Rhs *)&A);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)&TP,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TP,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&B);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&L1;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&transLineU;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&L1_1,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                      *)&svd);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&L2;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&transLineU;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&L2_1,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                      *)&svd);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&L3;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&transLineU;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&L3_1,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                      *)&svd);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&transLineV;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&M1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&M1_1,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                      *)&svd);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&transLineV;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&M2;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&M2_1,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                      *)&svd);
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)&transLineV;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&M3;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&M3_1,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                      *)&svd);
    local_8ec = L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
    local_8f0 = L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5];
    local_904 = L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0];
    local_90c = L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1];
    local_91c = L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
    local_908 = L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3];
    local_910 = L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4];
    local_920 = L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5];
    A.super_PlainObjectBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
         L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         * M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [3] + L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] *
                 M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0];
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    local_934 = L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0];
    B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.array[0] =
         L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
         * M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [3] + L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] *
                 M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0];
    local_93c = L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1];
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 1;
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixV.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data = (float *)0x1;
    local_94c = L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
    local_938 = L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3];
    local_940 = L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4];
    local_950 = L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5];
    local_8f4 = M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
    local_8f8 = M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5];
    local_8fc = M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0];
    local_914 = M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1];
    local_924 = M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
    local_900 = M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3];
    local_918 = M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4];
    local_928 = M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5];
    local_92c = M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0];
    local_944 = M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1];
    local_954 = M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
    local_930 = M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3];
    local_948 = M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4];
    local_958 = M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5];
    svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data = (float *)&A;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_> *)&svd,(Scalar *)&B)
    ;
    TP.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
         * local_8ec +
         M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         * local_8f0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)&TP);
    local_4b8._0_4_ =
         L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         * M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4] + L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] *
                 M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)local_4b8);
    b.
    super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ =
         L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
         * M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4] + L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] *
                 M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)&b);
    b_sol.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
         * local_8ec +
         M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
         * local_8f0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)&b_sol);
    P.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data._0_4_ =
         L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         * local_8f8 +
         L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
         * local_8f4;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)&P);
    local_830._0_4_ =
         L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
         * local_8f8 +
         L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
         * local_8f4;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)&local_830);
    b1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (float *)CONCAT44(b1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data._4_4_,local_8ec * local_8f8 + local_8f0 * local_8f4);
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)&b1);
    b2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (float *)CONCAT44(b2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data._4_4_,local_904 * local_900 + local_908 * local_8fc);
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)&b2);
    b3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (float *)CONCAT44(b3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data._4_4_,local_90c * local_900 + local_910 * local_8fc);
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)&b3);
    b4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (float *)CONCAT44(b4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data._4_4_,local_900 * local_91c + local_8fc * local_920);
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)&b4);
    b5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (float *)CONCAT44(b5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data._4_4_,local_904 * local_918 + local_908 * local_914);
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,(Scalar *)&b5);
    a = local_90c * local_918 + local_910 * local_914;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_(pCVar7,&a);
    local_504 = local_918 * local_91c + local_914 * local_920;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_504);
    local_508 = local_904 * local_928 + local_908 * local_924;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_508);
    local_50c = local_90c * local_928 + local_910 * local_924;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_50c);
    local_510 = local_91c * local_928 + local_920 * local_924;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_510);
    local_514 = local_934 * local_930 + local_938 * local_92c;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_514);
    local_518 = local_93c * local_930 + local_940 * local_92c;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_518);
    local_51c = local_930 * local_94c + local_92c * local_950;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_51c);
    local_520 = local_934 * local_948 + local_938 * local_944;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_520);
    local_524 = local_93c * local_948 + local_940 * local_944;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_524);
    local_528 = local_948 * local_94c + local_944 * local_950;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_528);
    local_52c = local_934 * local_958 + local_938 * local_954;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_52c);
    local_530 = local_93c * local_958 + local_940 * local_954;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                       (pCVar7,&local_530);
    local_534 = local_94c * local_958 + local_950 * local_954;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_(pCVar7,&local_534);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::finished
              ((CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_> *)&svd);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<float,3,9,0,3,9>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&B,
               (DenseBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_> *)&A);
    Eigen::BDCSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::BDCSVD(&svd,(MatrixType *)&B,0x14);
    free((void *)B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.
                 array._0_8_);
    this = Eigen::SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::matrixV
                     (&svd.super_SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>);
    Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topRightCorner<int,int>
              ((Type *)&TP,this,9,6);
    Eigen::PlainObjectBase<Eigen::Matrix<float,9,6,0,9,6>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,9,6,0,9,6>> *)&B,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                *)&TP);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<float,9,6,0,9,6>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_350,
               (DenseBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_> *)&B);
    genposeandscale_solvecoeffs<float>(&b,&local_350);
    free(local_350.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    b1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data = (float *)0x0
    ;
    b1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    b2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data = (float *)0x0
    ;
    b2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    b3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data = (float *)0x0
    ;
    b3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    b4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data = (float *)0x0
    ;
    b4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    b5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data = (float *)0x0
    ;
    b5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
              (&b5,b.
                   super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    b.
    super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         b.
         super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    Eigen::DenseStorage<float,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<float,__1,__1,_1,_0> *)
               b.
               super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
              (&b4,b.
                   super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    b.
    super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         b.
         super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    Eigen::DenseStorage<float,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<float,__1,__1,_1,_0> *)
               b.
               super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
              (&b3,b.
                   super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    b.
    super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         b.
         super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    Eigen::DenseStorage<float,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<float,__1,__1,_1,_0> *)
               b.
               super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
              (&b2,b.
                   super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    b.
    super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         b.
         super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    Eigen::DenseStorage<float,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<float,__1,__1,_1,_0> *)
               b.
               super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
              (&b1,b.
                   super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    b.
    super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         b.
         super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    Eigen::DenseStorage<float,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<float,__1,__1,_1,_0> *)
               b.
               super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_4b8._0_4_ = 9;
    local_830 = (Matrix<float,_1,_1,0,_1,_1> *)CONCAT44(local_830._4_4_,1);
    Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<float,_1,_1,0,_1,_1> *)&P,(int *)local_4b8,(int *)&local_830);
    for (index = 0;
        index < b1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        index = index + 1) {
      Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
                ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&TP,4,4);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&b1,index);
      local_4b0.m_value = 0;
      local_4a8.m_value = 1;
      local_4a0.m_value = 1;
      b_sol.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
           *pSVar8;
      local_4b8 = (undefined1  [8])&b_sol;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&b2,index);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_4b8,pSVar8
                         );
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&b3,index);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator_
                         (pCVar9,pSVar8);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&b4,index);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator_
                         (pCVar9,pSVar8);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&b5,index);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator_
                         (pCVar9,pSVar8);
      local_830 = (Matrix<float,_1,_1,0,_1,_1> *)CONCAT44(local_830._4_4_,0x3f800000);
      Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator_
                (pCVar9,(Scalar *)&local_830);
      Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_4b8);
      local_4b8 = (undefined1  [8])&B;
      local_4b0.m_value = (long)&b_sol;
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<float,9,6,0,9,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
                (&P,(Product<Eigen::Matrix<float,_9,_6,_0,_9,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                     *)local_4b8);
      Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&P,3,3);
      Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_4b8,&P,0);
      a = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
          norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               local_4b8);
      SVar11 = Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::determinant
                         ((MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&P);
      if (SVar11 < 0.0) {
        a = -a;
      }
      Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator/
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                  *)local_4b8,(MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&P,&a);
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>>
                (&P,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                     *)local_4b8);
      local_830 = (Matrix<float,_1,_1,0,_1,_1> *)&P;
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                ((Type *)local_4b8,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&TP,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_4b8,
                 (Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&local_830);
      local_830 = (Matrix<float,_1,_1,0,_1,_1> *)&TV;
      local_820 = &TU;
      local_828 = (DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                   *)&TP;
      Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
      _set_noalias<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_4b8,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                  *)&local_830);
      std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
      emplace_back<Eigen::Matrix<float,4,4,0,4,4>>
                ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                  *)__return_storage_ptr__,(Matrix<float,_4,_4,_0,_4,_4> *)local_4b8);
    }
    free((void *)CONCAT44(P.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                          m_storage.m_data._4_4_,
                          P.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                          m_storage.m_data._0_4_));
    free(b5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(b4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(b3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(b2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(b1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&b);
    Eigen::BDCSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~BDCSVD(&svd);
    std::
    _Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::~_Vector_base(&local_478);
    return __return_storage_ptr__;
  }
  poVar10 = std::operator<<((ostream *)&std::cerr,
                            "Solver 3L1Q requires at least 1 point, and 3 line pairs!");
  std::endl<char,std::char_traits<char>>(poVar10);
  exit(-1);
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver3L1Q(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 point, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> P1, P1_B, Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, Q31, Q32, R31_B, R32_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;

	Q11 = lPair[0].first.first; Q12 = lPair[0].first.second;
	R11_B = lPair[0].second.first; R12_B = lPair[0].second.second;
	Q21 = lPair[1].first.first; Q22 = lPair[1].first.second;
	R21_B = lPair[1].second.first; R22_B = lPair[1].second.second;
	Q31 = lPair[2].first.first; Q32 = lPair[2].first.second;
	R31_B = lPair[2].second.first; R32_B = lPair[2].second.second;


	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP11, tP12, tP21, tP22, tP31, tP32, tQ11, tQ12, tQ21, tQ22, tQ31, tQ32;
	// points first lines
	tP11 = Q11.head(3) / Q11(3);
	tP12 = Q12.head(3) / Q12(3);
	tQ11 = R11_B.head(3) / R11_B(3);
	tQ12 = R12_B.head(3) / R12_B(3);
	// points second lines
	tP21 = Q21.head(3) / Q21(3);
	tP22 = Q22.head(3) / Q22(3);
	tQ21 = R21_B.head(3) / R21_B(3);
	tQ22 = R22_B.head(3) / R22_B(3);
	// points third lines
	tP31 = Q31.head(3) / Q31(3);
	tP32 = Q32.head(3) / Q32(3);
	tQ31 = R31_B.head(3) / R31_B(3);
	tQ32 = R32_B.head(3) / R32_B(3);

	// computing the plucker coordinates of the lines
	// ref A
	Matrix<floatPrec, 3,1> D1 = tP12 - tP11;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP12.cross(tP11);
	L1 /= L1.head(3).norm();
	Matrix<floatPrec, 3,1> D2 = tP22 - tP21;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tP22.cross(tP21);
	L2 /= L2.head(3).norm();
	Matrix<floatPrec, 3,1> D3 = tP32 - tP31;
	Matrix<floatPrec, 6,1> L3;
	L3.head(3) = D3;
	L3.tail(3) = tP32.cross(tP31);
	L3 /= L3.head(3).norm();
	// ref B
	D1 = tQ12 - tQ11;
	Matrix<floatPrec, 6,1> M1;
	M1.head(3) = D1;
	M1.tail(3) = tQ12.cross(tQ11);
	M1 /= M1.head(3).norm();
	D2 = tQ22 - tQ21;
	Matrix<floatPrec, 6,1> M2;
	M2.head(3) = D2;
	M2.tail(3) = tQ22.cross(tQ21);
	M2 /= M2.head(3).norm();
	D3 = tQ32 - tQ31;
	Matrix<floatPrec, 6,1> M3;
	M3.head(3) = D3;
	M3.tail(3) = tQ32.cross(tQ31);
	M3 /= M3.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations3L1Q(P1, P1_B);
	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_1, L2_1, L3_1, M1_1, M2_1, M3_1;
	L1_1 = transLineU * L1;
	L2_1 = transLineU * L2;
	L3_1 = transLineU * L3;
	M1_1 = transLineV * M1;
	M2_1 = transLineV * M2;
	M3_1 = transLineV * M3;

	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26, l31, l32, l33, l34, l35, l36;
	l11 = L1_1[0];
	l12 = L1_1[1];
	l13 = L1_1[2];
	l14 = L1_1[3];
	l15 = L1_1[4];
	l16 = L1_1[5];
	l21 = L2_1[0];
	l22 = L2_1[1];
	l23 = L2_1[2];
	l24 = L2_1[3];
	l25 = L2_1[4];
	l26 = L2_1[5];
	l31 = L3_1[0];
	l32 = L3_1[1];
	l33 = L3_1[2];
	l34 = L3_1[3];
	l35 = L3_1[4];
	l36 = L3_1[5];
	floatPrec m11, m12, m13, m14, m15, m16, m21, m22, m23, m24, m25, m26, m31, m32, m33, m34, m35, m36;
	m11 = M1_1[0];
	m12 = M1_1[1];
	m13 = M1_1[2];
	m14 = M1_1[3];
	m15 = M1_1[4];
	m16 = M1_1[5];
	m21 = M2_1[0];
	m22 = M2_1[1];
	m23 = M2_1[2];
	m24 = M2_1[3];
	m25 = M2_1[4];
	m26 = M2_1[5];
	m31 = M3_1[0];
	m32 = M3_1[1];
	m33 = M3_1[2];
	m34 = M3_1[3];
	m35 = M3_1[4];
	m36 = M3_1[5];

	Matrix<floatPrec, 3,9> A;
	A << l11 * m14 + l14 * m11, l12 * m14 + l15 * m11, l13 * m14 + l16 * m11, l11 * m15 + l14 * m12, l12 * m15 + l15 * m12, l13 * m15 + l16 * m12, l11 * m16 + l14 * m13, l12 * m16 + l15 * m13, l13 * m16 + l16 * m13,
		l21 * m24 + l24 * m21, l22 * m24 + l25 * m21, l23 * m24 + l26 * m21, l21 * m25 + l24 * m22, l22 * m25 + l25 * m22, l23 * m25 + l26 * m22, l21 * m26 + l24 * m23, l22 * m26 + l25 * m23, l23 * m26 + l26 * m23,
		l31 * m34 + l34 * m31, l32 * m34 + l35 * m31, l33 * m34 + l36 * m31, l31 * m35 + l34 * m32, l32 * m35 + l35 * m32, l33 * m35 + l36 * m32, l31 * m36 + l34 * m33, l32 * m36 + l35 * m33, l33 * m36 + l36 * m33;

	BDCSVD<Matrix<floatPrec, Dynamic,Dynamic>> svd(A, ComputeFullU | ComputeFullV);
	Matrix<floatPrec, 9,6> B = svd.matrixV().topRightCorner(9, 6);

	vector<Matrix<floatPrec, Dynamic,1>> b = genposeandscale_solvecoeffs<floatPrec>(B);

	Matrix<floatPrec, Dynamic,1> b1, b2, b3, b4, b5;
	b5 = b.back();
	b.pop_back();
	b4 = b.back();
	b.pop_back();
	b3 = b.back();
	b.pop_back();
	b2 = b.back();
	b.pop_back();
	b1 = b.back();
	b.pop_back();

	Matrix<floatPrec, 4,4> TP;
	Matrix<floatPrec, 6,1> b_sol;
	Matrix<floatPrec, Dynamic,Dynamic> P(9,1);
	floatPrec a;
	for (int i = 0; i < b1.size(); i++)
	{
		TP.setIdentity(4,4);

		b_sol << b1[i], b2[i], b3[i], b4[i], b5[i], 1;
		
		P = B * b_sol;

		P.resize(3, 3);
		a = P.row(0).norm();

		if (P.determinant() < 0)
		{
			a = -a;
		}

		P = P / a;

		TP.topLeftCorner(3, 3) = P.transpose();

		out.push_back(TV.inverse() * TP * TU);
	}

	return out;
}